

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

Status __thiscall
leveldb::log::LogTest::StringSource::Read(StringSource *this,size_t n,Slice *result,char *scratch)

{
  Tester *this_00;
  Slice *pSVar1;
  char *d;
  Slice local_210;
  Slice local_200;
  Slice local_1f0 [2];
  Tester local_1d0;
  char *scratch_local;
  Slice *result_local;
  size_t n_local;
  StringSource *this_local;
  
  scratch_local = scratch;
  result_local = result;
  n_local = n;
  this_local = this;
  test::Tester::Tester
            (&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0xb4);
  this_00 = test::Tester::Is(&local_1d0,(bool)(~*(byte *)(n + 0x19) & 1),"!returned_partial_");
  test::Tester::operator<<(this_00,(char (*) [32])"must not Read() after eof/error");
  test::Tester::~Tester(&local_1d0);
  if ((*(byte *)(n + 0x18) & 1) == 0) {
    pSVar1 = (Slice *)Slice::size((Slice *)(n + 8));
    if (pSVar1 < result_local) {
      result_local = (Slice *)Slice::size((Slice *)(n + 8));
      *(undefined1 *)(n + 0x19) = 1;
    }
    d = Slice::data((Slice *)(n + 8));
    Slice::Slice(&local_210,d,(size_t)result_local);
    *(char **)scratch_local = local_210.data_;
    *(size_t *)(scratch_local + 8) = local_210.size_;
    Slice::remove_prefix((Slice *)(n + 8),(size_t)result_local);
    Status::OK();
  }
  else {
    *(undefined1 *)(n + 0x18) = 0;
    *(undefined1 *)(n + 0x19) = 1;
    Slice::Slice(local_1f0,"read error");
    Slice::Slice(&local_200);
    Status::Corruption((Status *)this,local_1f0,&local_200);
  }
  return (Status)(char *)this;
}

Assistant:

Status Read(size_t n, Slice* result, char* scratch) override {
      ASSERT_TRUE(!returned_partial_) << "must not Read() after eof/error";

      if (force_error_) {
        force_error_ = false;
        returned_partial_ = true;
        return Status::Corruption("read error");
      }

      if (contents_.size() < n) {
        n = contents_.size();
        returned_partial_ = true;
      }
      *result = Slice(contents_.data(), n);
      contents_.remove_prefix(n);
      return Status::OK();
    }